

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVD.hpp
# Opt level: O2

void __thiscall JAMA::SVD<double>::SVD(SVD<double> *this,DynamicRectMatrix<double> *Arg)

{
  DynamicRectMatrix<double> *m;
  DynamicVector<double,_std::allocator<double>_> *pDVar1;
  double dVar2;
  double *pdVar3;
  double **ppdVar4;
  double **ppdVar5;
  undefined1 auVar6 [16];
  uint ncol;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  pointer pdVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  double **ppdVar26;
  int iVar27;
  uint uVar28;
  int iVar29;
  long lVar30;
  ulong uVar31;
  uint uVar32;
  long lVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  undefined1 auVar40 [16];
  long local_130;
  double local_128;
  DynamicVector<double,_std::allocator<double>_> e;
  DynamicRectMatrix<double> A;
  long local_98;
  long local_90;
  DynamicVector<double,_std::allocator<double>_> work;
  DynamicRectMatrix<double> local_50;
  DynamicRectMatrix<double> local_40;
  
  m = &this->V;
  pDVar1 = &this->s;
  (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->V).data_ = (double **)0x0;
  (this->V).nrow_ = 0;
  (this->V).ncol_ = 0;
  (this->U).data_ = (double **)0x0;
  (this->U).nrow_ = 0;
  (this->U).ncol_ = 0;
  (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar28 = Arg->nrow_;
  this->m = uVar28;
  uVar8 = Arg->ncol_;
  this->n = uVar8;
  ncol = uVar28;
  if ((int)uVar8 < (int)uVar28) {
    ncol = uVar8;
  }
  uVar7 = uVar28 + 1;
  if ((int)uVar8 < (int)(uVar28 + 1)) {
    uVar7 = uVar8;
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&e.data_,(long)(int)uVar7,(allocator_type *)&work);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&pDVar1->data_,(_Vector_base<double,_std::allocator<double>_> *)&e);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&e);
  OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix
            ((DynamicRectMatrix<double> *)&e,this->m,ncol,0.0);
  OpenMD::DynamicRectMatrix<double>::operator=(&local_40,&this->U);
  OpenMD::DynamicRectMatrix<double>::deallocate(&local_40);
  OpenMD::DynamicRectMatrix<double>::deallocate((DynamicRectMatrix<double> *)&e);
  OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix
            ((DynamicRectMatrix<double> *)&e,this->n,this->n);
  OpenMD::DynamicRectMatrix<double>::operator=(&local_50,m);
  OpenMD::DynamicRectMatrix<double>::deallocate(&local_50);
  OpenMD::DynamicRectMatrix<double>::deallocate((DynamicRectMatrix<double> *)&e);
  std::vector<double,_std::allocator<double>_>::vector
            (&e.data_,(long)this->n,(allocator_type *)&work);
  std::vector<double,_std::allocator<double>_>::vector
            (&work.data_,(long)this->m,(allocator_type *)&A);
  OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix(&A,Arg);
  uVar28 = this->m;
  uVar8 = this->n;
  uVar7 = uVar28 - 1;
  if ((int)uVar8 < (int)(uVar28 - 1)) {
    uVar7 = uVar8;
  }
  uVar14 = uVar8 - 2;
  if ((int)uVar28 < (int)(uVar8 - 2)) {
    uVar14 = uVar28;
  }
  uVar22 = 0;
  if (0 < (int)uVar14) {
    uVar22 = (ulong)uVar14;
  }
  uVar24 = uVar22;
  if ((int)uVar22 < (int)uVar7) {
    uVar24 = (ulong)uVar7;
  }
  lVar30 = (long)(int)uVar7;
  local_130 = 1;
  uVar13 = 0;
  while (uVar13 != uVar24) {
    pdVar16 = (pDVar1->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar27 = (int)uVar13;
    if ((long)uVar13 < lVar30) {
      pdVar16[uVar13] = 0.0;
      dVar34 = 0.0;
      for (uVar20 = uVar13; uVar28 = this->m, (long)uVar20 < (long)(int)uVar28; uVar20 = uVar20 + 1)
      {
        dVar34 = hypot(dVar34,A.data_[uVar20][uVar13]);
        (pDVar1->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar13] = dVar34;
      }
      pdVar16 = (pDVar1->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      dVar34 = pdVar16[uVar13];
      if ((dVar34 != 0.0) || (NAN(dVar34))) {
        pdVar3 = A.data_[uVar13];
        if (pdVar3[uVar13] <= 0.0 && pdVar3[uVar13] != 0.0) {
          pdVar16[uVar13] = -dVar34;
        }
        uVar12 = (ulong)uVar28;
        uVar20 = uVar13;
        if ((int)uVar28 <= iVar27) {
          uVar12 = uVar13 & 0xffffffff;
        }
        for (; uVar12 != uVar20; uVar20 = uVar20 + 1) {
          A.data_[uVar20][uVar13] = A.data_[uVar20][uVar13] / pdVar16[uVar13];
        }
        pdVar3[uVar13] = pdVar3[uVar13] + 1.0;
        dVar34 = pdVar16[uVar13];
      }
      pdVar16[uVar13] = -dVar34;
      pdVar16 = (pDVar1->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
    uVar28 = this->m;
    uVar8 = this->n;
    uVar20 = uVar13 & 0xffffffff;
    lVar33 = local_130;
    if (iVar27 < (int)uVar28) {
      uVar20 = (ulong)uVar28;
    }
    for (; lVar33 < (int)uVar8; lVar33 = lVar33 + 1) {
      if (((long)uVar13 < lVar30) && ((pdVar16[uVar13] != 0.0 || (NAN(pdVar16[uVar13]))))) {
        dVar34 = 0.0;
        for (uVar12 = uVar13; uVar20 != uVar12; uVar12 = uVar12 + 1) {
          dVar34 = dVar34 + A.data_[uVar12][uVar13] * A.data_[uVar12][lVar33];
        }
        dVar36 = A.data_[uVar13][uVar13];
        for (uVar12 = uVar13; uVar20 != uVar12; uVar12 = uVar12 + 1) {
          pdVar3 = A.data_[uVar12];
          pdVar3[lVar33] = pdVar3[uVar13] * (-dVar34 / dVar36) + pdVar3[lVar33];
        }
      }
      e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar33] = A.data_[uVar13][lVar33];
    }
    if ((long)uVar13 < lVar30) {
      uVar28 = this->m;
      ppdVar4 = (this->U).data_;
      uVar12 = uVar13 & 0xffffffff;
      uVar20 = uVar13;
      if (iVar27 < (int)uVar28) {
        uVar12 = (ulong)uVar28;
      }
      for (; uVar12 != uVar20; uVar20 = uVar20 + 1) {
        ppdVar4[uVar20][uVar13] = A.data_[uVar20][uVar13];
      }
    }
    uVar20 = uVar13 + 1;
    if ((long)uVar13 < (long)(int)uVar14) {
      e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar13] = 0.0;
      lVar33 = local_130;
      while( true ) {
        uVar8 = this->n;
        lVar17 = (long)(int)uVar8;
        dVar34 = e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar13];
        if (lVar17 <= lVar33) break;
        dVar34 = hypot(dVar34,e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar33]);
        e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar13] = dVar34;
        lVar33 = lVar33 + 1;
      }
      if ((dVar34 != 0.0) || (NAN(dVar34))) {
        lVar33 = local_130;
        if (e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar20] <= 0.0 &&
            e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar20] != 0.0) {
          e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar13] = -dVar34;
        }
        for (; lVar33 < lVar17; lVar33 = lVar33 + 1) {
          e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar33] =
               e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar33] /
               e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar13];
        }
        e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar20] =
             e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar20] + 1.0;
        dVar34 = e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar13];
      }
      e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar13] = -dVar34;
      uVar28 = this->m;
      lVar23 = (long)(int)uVar28;
      lVar33 = local_130;
      if (dVar34 != -dVar34 && (long)uVar20 < lVar23) {
        for (; lVar25 = local_130, lVar33 < lVar23; lVar33 = lVar33 + 1) {
          work.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar33] = 0.0;
        }
        for (; lVar33 = local_130, lVar25 < lVar17; lVar25 = lVar25 + 1) {
          for (; lVar33 < lVar23; lVar33 = lVar33 + 1) {
            work.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar33] =
                 e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar25] * A.data_[lVar33][lVar25] +
                 work.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar33];
          }
        }
        for (; lVar33 < lVar17; lVar33 = lVar33 + 1) {
          dVar34 = e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar33];
          dVar36 = e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar20];
          for (lVar25 = local_130; lVar25 < lVar23; lVar25 = lVar25 + 1) {
            A.data_[lVar25][lVar33] =
                 work.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar25] * (-dVar34 / dVar36) +
                 A.data_[lVar25][lVar33];
          }
        }
      }
      ppdVar4 = m->data_;
      for (lVar33 = local_130; lVar33 < lVar17; lVar33 = lVar33 + 1) {
        ppdVar4[lVar33][uVar13] =
             e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar33];
      }
    }
    local_130 = local_130 + 1;
    uVar13 = uVar20;
  }
  uVar10 = uVar28 + 1;
  if ((int)uVar8 <= (int)(uVar28 + 1)) {
    uVar10 = uVar8;
  }
  uVar24 = (ulong)uVar7;
  if ((int)uVar7 < (int)uVar8) {
    (pDVar1->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar30] = A.data_[uVar24][uVar24];
  }
  if ((int)uVar28 < (int)uVar8) {
    (pDVar1->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[(long)(int)uVar10 + -1] = 0.0;
  }
  uVar13 = (ulong)uVar8;
  if ((int)uVar22 + 1 < (int)uVar10) {
    e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar22] = A.data_[uVar22][uVar10 - 1];
  }
  lVar33 = (long)(int)(uVar10 - 1);
  e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[lVar33] = 0.0;
  ppdVar4 = (this->U).data_;
  uVar22 = 0;
  uVar32 = uVar7;
  if (0 < (int)uVar28) {
    uVar22 = (ulong)uVar28;
  }
  for (; (int)uVar32 < (int)ncol; uVar32 = uVar32 + 1) {
    ppdVar5 = (this->U).data_;
    for (uVar20 = 0; uVar22 != uVar20; uVar20 = uVar20 + 1) {
      ppdVar5[uVar20][uVar32] = 0.0;
    }
    ppdVar4[uVar32][uVar32] = 1.0;
  }
  ppdVar4 = (this->U).data_;
  pdVar16 = (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  while (uVar7 = uVar7 - 1, 0 < lVar30) {
    lVar17 = lVar30 + -1;
    dVar34 = pdVar16[lVar17];
    ppdVar5 = (this->U).data_;
    if ((dVar34 != 0.0) || (NAN(dVar34))) {
      for (uVar20 = uVar24; ppdVar26 = (this->U).data_, (int)uVar20 < (int)ncol; uVar20 = uVar20 + 1
          ) {
        ppdVar26 = ppdVar26 + uVar7;
        dVar34 = 0.0;
        for (uVar32 = uVar7; (int)uVar32 < (int)uVar28; uVar32 = uVar32 + 1) {
          dVar34 = dVar34 + (*ppdVar26)[lVar17] * (*ppdVar26)[uVar20];
          ppdVar26 = ppdVar26 + 1;
        }
        dVar36 = ppdVar5[lVar17][lVar17];
        ppdVar26 = ppdVar5 + uVar7;
        for (uVar32 = uVar7; (int)uVar32 < (int)uVar28; uVar32 = uVar32 + 1) {
          pdVar3 = *ppdVar26;
          pdVar3[uVar20] = pdVar3[lVar17] * (-dVar34 / dVar36) + pdVar3[uVar20];
          ppdVar26 = ppdVar26 + 1;
        }
      }
      ppdVar26 = ppdVar26 + uVar7;
      for (uVar32 = uVar7; (int)uVar32 < (int)uVar28; uVar32 = uVar32 + 1) {
        (*ppdVar26)[lVar17] = -(*ppdVar26)[lVar17];
        ppdVar26 = ppdVar26 + 1;
      }
      ppdVar4[lVar17][lVar17] = ppdVar4[lVar17][lVar17] + 1.0;
      for (lVar23 = 0; lVar23 < lVar30 + -2; lVar23 = lVar23 + 1) {
        ppdVar4[lVar23][lVar17] = 0.0;
      }
    }
    else {
      for (uVar20 = 0; uVar22 != uVar20; uVar20 = uVar20 + 1) {
        ppdVar5[uVar20][lVar17] = 0.0;
      }
      ppdVar4[lVar17][lVar17] = 1.0;
    }
    uVar24 = uVar24 - 1;
    lVar30 = lVar17;
  }
  ppdVar4 = m->data_;
  lVar30 = 0;
  uVar22 = 0;
  if (0 < (int)uVar8) {
    uVar22 = (ulong)uVar8;
  }
  lVar17 = 0;
  uVar24 = uVar13;
  while (0 < (int)uVar24) {
    uVar20 = uVar24 - 1;
    ppdVar5 = m->data_;
    ppdVar26 = ppdVar5;
    if (((int)uVar24 <= (int)uVar14) &&
       ((uVar12 = uVar24,
        e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar20] != 0.0 ||
        (NAN(e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar20]))))) {
      for (; ppdVar26 = m->data_, (int)uVar12 < (int)ncol; uVar12 = uVar12 + 1) {
        dVar34 = 0.0;
        for (lVar23 = lVar17; (int)(uVar8 + (int)lVar23) < (int)uVar8; lVar23 = lVar23 + 1) {
          dVar34 = dVar34 + ppdVar26[uVar13 + lVar23][uVar20] * ppdVar26[uVar13 + lVar23][uVar12];
        }
        dVar36 = ppdVar5[uVar24][uVar20];
        for (uVar31 = uVar13; (int)lVar17 + (int)uVar31 < (int)uVar8; uVar31 = uVar31 + 1) {
          lVar23 = *(long *)((long)ppdVar5 + uVar31 * 8 + lVar30);
          *(double *)(lVar23 + uVar12 * 8) =
               *(double *)(lVar23 + uVar20 * 8) * (-dVar34 / dVar36) +
               *(double *)(lVar23 + uVar12 * 8);
        }
      }
    }
    for (uVar24 = 0; uVar22 != uVar24; uVar24 = uVar24 + 1) {
      ppdVar26[uVar24][uVar20] = 0.0;
    }
    ppdVar4[uVar20][uVar20] = 1.0;
    lVar17 = lVar17 + -1;
    lVar30 = lVar30 + -8;
    uVar24 = uVar20;
  }
  uVar22 = 0;
  if (0 < (int)uVar10) {
    uVar22 = (ulong)uVar10;
  }
  iVar27 = uVar10 - 2;
  iVar29 = 2 - uVar10;
  local_90 = lVar33 << 0x20;
  local_98 = lVar33 * 8;
  uVar24 = (ulong)uVar10;
  local_130 = lVar33;
  do {
    uVar13 = (ulong)iVar27;
    uVar20 = (ulong)(int)(uVar10 - 2);
    uVar28 = uVar10 - 1;
LAB_001da256:
    if ((int)uVar10 < 1) {
      OpenMD::DynamicRectMatrix<double>::deallocate(&A);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&work);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&e);
      return;
    }
    for (uVar12 = 0; ~uVar13 != uVar12; uVar12 = uVar12 - 1) {
      pdVar3 = (pDVar1->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + uVar13 + uVar12;
      if (ABS(e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar13 + uVar12]) <=
          (ABS(pdVar3[1]) + ABS(*pdVar3)) * 2.220446049250313e-16) {
        iVar9 = (int)uVar12 - iVar29;
        e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar13 + uVar12] = 0.0;
        goto LAB_001da2c5;
      }
    }
    iVar9 = -1;
LAB_001da2c5:
    if (iVar9 != uVar10 - 2) {
      lVar23 = (long)iVar9;
      uVar12 = (ulong)(iVar9 + 1);
      pdVar16 = (pDVar1->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar30 = local_90;
      for (lVar17 = 0; uVar31 = local_130 + lVar17, lVar23 < (long)uVar31; lVar17 = lVar17 + -1) {
        dVar36 = 0.0;
        dVar34 = 0.0;
        if (uVar24 - lVar33 != lVar17) {
          dVar34 = ABS(*(double *)
                        ((long)e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar17 * 8 + local_98));
        }
        if ((local_130 - uVar12) + lVar17 != 0) {
          dVar36 = ABS(*(double *)
                        ((long)e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar17 * 8 + local_98 + -8));
        }
        if (ABS(*(double *)((long)pdVar16 + lVar17 * 8 + local_98)) <=
            (dVar34 + dVar36) * 2.220446049250313e-16) {
          *(undefined8 *)((long)pdVar16 + lVar17 * 8 + local_98) = 0;
          break;
        }
        lVar30 = lVar30 + -0x100000000;
      }
      iVar15 = (int)lVar17;
      if (iVar15 + ((int)local_130 - iVar9) == 0) {
        pdVar16 = (pDVar1->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        dVar35 = ABS(pdVar16[uVar28]);
        dVar34 = ABS(pdVar16[uVar20]);
        auVar40._8_8_ =
             e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar20];
        auVar40._0_8_ = pdVar16[uVar28];
        dVar36 = ABS(e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar20]);
        if (dVar34 <= dVar35) {
          dVar34 = dVar35;
        }
        dVar35 = ABS(pdVar16[uVar12]);
        if (dVar36 <= dVar34) {
          dVar36 = dVar34;
        }
        dVar34 = ABS(e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar12]);
        if (dVar35 <= dVar36) {
          dVar35 = dVar36;
        }
        if (dVar34 <= dVar35) {
          dVar34 = dVar35;
        }
        dVar36 = pdVar16[uVar20] / dVar34;
        auVar6._8_8_ = dVar34;
        auVar6._0_8_ = dVar34;
        auVar40 = divpd(auVar40,auVar6);
        dVar38 = auVar40._0_8_;
        dVar35 = auVar40._8_8_;
        dVar37 = (dVar35 * dVar35 + (dVar36 - dVar38) * (dVar36 + dVar38)) * 0.5;
        dVar35 = dVar38 * dVar35 * dVar38 * dVar35;
        dVar36 = 0.0;
        if ((((dVar37 != 0.0) || (NAN(dVar37))) || (dVar35 != 0.0)) || (NAN(dVar35))) {
          dVar36 = SQRT(dVar37 * dVar37 + dVar35);
          dVar36 = dVar35 / ((double)((ulong)-dVar36 & -(ulong)(dVar37 < 0.0) |
                                     ~-(ulong)(dVar37 < 0.0) & (ulong)dVar36) + dVar37);
        }
        dVar35 = pdVar16[uVar12] / dVar34;
        dVar36 = (dVar35 - dVar38) * (dVar35 + dVar38) + dVar36;
        dVar35 = (e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar12] / dVar34) * dVar35;
        uVar31 = uVar12;
        while (uVar11 = uVar31, (long)uVar11 < (long)(int)uVar28) {
          dVar34 = hypot(dVar36,dVar35);
          if (uVar11 != uVar12) {
            e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar11 - 1] = dVar34;
          }
          dVar36 = dVar36 / dVar34;
          dVar35 = dVar35 / dVar34;
          pdVar16 = (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          dVar34 = pdVar16[uVar11];
          dVar37 = e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar11];
          e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11] = dVar37 * dVar36 - dVar34 * dVar35;
          dVar38 = pdVar16[uVar11 + 1];
          pdVar16[uVar11 + 1] = dVar36 * dVar38;
          ppdVar4 = (this->V).data_;
          uVar21 = uVar11 & 0xffffffff;
          uVar31 = (ulong)(uint)this->n;
          if (this->n < 1) {
            uVar31 = 0;
          }
          for (uVar18 = 0; uVar31 != uVar18; uVar18 = uVar18 + 1) {
            pdVar3 = ppdVar4[uVar18];
            dVar39 = pdVar3[uVar21];
            dVar2 = pdVar3[uVar11 + 1];
            pdVar3[uVar11 + 1] = dVar39 * -dVar35 + dVar2 * dVar36;
            pdVar3[uVar21] = dVar36 * dVar39 + dVar35 * dVar2;
          }
          dVar39 = dVar36 * dVar34 + dVar35 * dVar37;
          dVar35 = dVar35 * dVar38;
          dVar34 = hypot(dVar39,dVar35);
          dVar39 = dVar39 / dVar34;
          dVar37 = dVar35 / dVar34;
          pdVar16 = (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar16[uVar11] = dVar34;
          dVar36 = dVar39 * e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar11] + dVar37 * pdVar16[uVar11 + 1];
          pdVar16[uVar11 + 1] =
               pdVar16[uVar11 + 1] * dVar39 -
               e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar11] * dVar37;
          dVar35 = dVar37 * e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar11 + 1];
          e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11 + 1] =
               e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar11 + 1] * dVar39;
          uVar8 = this->m;
          uVar31 = uVar11 + 1;
          if ((long)uVar11 < (long)(int)uVar8 + -1) {
            ppdVar4 = (this->U).data_;
            uVar18 = (ulong)uVar8;
            if ((int)uVar8 < 1) {
              uVar18 = 0;
            }
            for (uVar19 = 0; uVar18 != uVar19; uVar19 = uVar19 + 1) {
              pdVar3 = ppdVar4[uVar19];
              dVar34 = pdVar3[uVar21];
              dVar38 = pdVar3[uVar11 + 1];
              pdVar3[uVar11 + 1] = dVar34 * -dVar37 + dVar38 * dVar39;
              pdVar3[uVar21] = dVar39 * dVar34 + dVar37 * dVar38;
            }
          }
        }
        e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar20] = dVar36;
      }
      else {
        if (iVar15 != 0) {
          iVar9 = (int)uVar31;
        }
        uVar12 = (ulong)(iVar9 + 1);
        if (iVar15 == 0) {
          local_128 = e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar20];
          e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar20] = 0.0;
          for (uVar31 = uVar20; lVar23 < (long)uVar31; uVar31 = uVar31 - 1) {
            dVar34 = hypot((pDVar1->data_).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar31],local_128);
            pdVar16 = (pDVar1->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            dVar36 = pdVar16[uVar31] / dVar34;
            dVar35 = local_128 / dVar34;
            pdVar16[uVar31] = dVar34;
            dVar34 = -dVar35;
            if (uVar31 != uVar12) {
              local_128 = e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar31 - 1] * dVar34;
              e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar31 - 1] =
                   dVar36 * e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar31 - 1];
            }
            ppdVar4 = (this->V).data_;
            uVar11 = (ulong)(uint)this->n;
            if (this->n < 1) {
              uVar11 = 0;
            }
            for (uVar21 = 0; uVar11 != uVar21; uVar21 = uVar21 + 1) {
              pdVar3 = ppdVar4[uVar21];
              dVar37 = pdVar3[uVar31 & 0xffffffff];
              dVar38 = pdVar3[uVar28];
              pdVar3[uVar28] = dVar37 * dVar34 + dVar38 * dVar36;
              pdVar3[uVar31 & 0xffffffff] = dVar36 * dVar37 + dVar35 * dVar38;
            }
          }
        }
        else {
          dVar34 = *(double *)
                    ((long)e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + (lVar30 >> 0x1d));
          *(undefined8 *)
           ((long)e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + (lVar30 >> 0x1d)) = 0;
          for (; (long)uVar12 < (long)(ulong)uVar10; uVar12 = uVar12 + 1) {
            dVar35 = hypot((this->s).data_.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar12],dVar34);
            pdVar16 = (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            dVar37 = pdVar16[uVar12] / dVar35;
            pdVar16[uVar12] = dVar35;
            dVar38 = -(dVar34 / dVar35);
            dVar36 = e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar12];
            e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar12] = dVar37 * dVar36;
            ppdVar4 = (this->U).data_;
            uVar11 = (ulong)(uint)this->m;
            if (this->m < 1) {
              uVar11 = 0;
            }
            for (uVar21 = 0; uVar11 != uVar21; uVar21 = uVar21 + 1) {
              pdVar3 = ppdVar4[uVar21];
              dVar39 = pdVar3[uVar12 & 0xffffffff];
              dVar2 = pdVar3[uVar31 & 0xffffffff];
              pdVar3[uVar31 & 0xffffffff] = dVar39 * dVar38 + dVar2 * dVar37;
              pdVar3[uVar12 & 0xffffffff] = dVar37 * dVar39 + (dVar34 / dVar35) * dVar2;
            }
            dVar34 = dVar36 * dVar38;
          }
        }
      }
      goto LAB_001da256;
    }
    uVar13 = (ulong)(int)uVar28;
    pdVar16 = (pDVar1->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    dVar34 = pdVar16[uVar13];
    if (dVar34 <= 0.0) {
      pdVar16[uVar13] = (double)(-(ulong)(dVar34 < -dVar34) & (ulong)-dVar34);
      ppdVar4 = m->data_;
      for (uVar20 = 0; uVar22 != uVar20; uVar20 = uVar20 + 1) {
        ppdVar4[uVar20][uVar28] = -ppdVar4[uVar20][uVar28];
      }
    }
    uVar28 = this->n;
    uVar8 = this->m;
    uVar20 = 0;
    if (0 < (int)uVar28) {
      uVar20 = (ulong)uVar28;
    }
    uVar12 = 0;
    if (0 < (int)uVar8) {
      uVar12 = (ulong)uVar8;
    }
    while (uVar31 = uVar13, (long)uVar31 < lVar33) {
      dVar34 = pdVar16[uVar31];
      if (pdVar16[uVar31 + 1] <= dVar34) break;
      pdVar16[uVar31] = pdVar16[uVar31 + 1];
      pdVar16[uVar31 + 1] = dVar34;
      if ((long)uVar31 < (long)(int)uVar28 + -1) {
        ppdVar4 = m->data_;
        for (uVar13 = 0; uVar20 != uVar13; uVar13 = uVar13 + 1) {
          pdVar3 = ppdVar4[uVar13];
          dVar34 = pdVar3[uVar31 + 1];
          pdVar3[uVar31 + 1] = pdVar3[uVar31 & 0xffffffff];
          pdVar3[uVar31 & 0xffffffff] = dVar34;
        }
      }
      uVar13 = uVar31 + 1;
      if ((long)uVar31 < (long)(int)uVar8 + -1) {
        ppdVar4 = (this->U).data_;
        for (uVar11 = 0; uVar12 != uVar11; uVar11 = uVar11 + 1) {
          pdVar3 = ppdVar4[uVar11];
          dVar34 = pdVar3[uVar31 + 1];
          pdVar3[uVar31 + 1] = pdVar3[uVar31 & 0xffffffff];
          pdVar3[uVar31 & 0xffffffff] = dVar34;
        }
      }
    }
    uVar10 = uVar10 - 1;
    iVar27 = iVar27 + -1;
    iVar29 = iVar29 + 1;
    local_130 = local_130 + -1;
    local_90 = local_90 + -0x100000000;
    local_98 = local_98 + -8;
  } while( true );
}

Assistant:

SVD(const DynamicRectMatrix<Real>& Arg) {
      m      = Arg.getNRow();
      n      = Arg.getNCol();
      int nu = min(m, n);
      s      = DynamicVector<Real>(min(m + 1, n));
      U      = DynamicRectMatrix<Real>(m, nu, Real(0));
      V      = DynamicRectMatrix<Real>(n, n);
      DynamicVector<Real> e(n);
      DynamicVector<Real> work(m);
      DynamicRectMatrix<Real> A(Arg);

      int wantu = 1; /* boolean */
      int wantv = 1; /* boolean */
      int i = 0, j = 0, k = 0;

      // Reduce A to bidiagonal form, storing the diagonal elements
      // in s and the super-diagonal elements in e.

      int nct = min(m - 1, n);
      int nrt = max(0, min(n - 2, m));

      for (k = 0; k < max(nct, nrt); k++) {
        if (k < nct) {
          // Compute the transformation for the k-th column and
          // place the k-th diagonal in s(k).
          // Compute 2-norm of k-th column without under/overflow.
          s(k) = 0;
          for (i = k; i < m; i++) {
            s(k) = hypot(s(k), A(i, k));
          }
          if (s(k) != 0.0) {
            if (A(k, k) < 0.0) { s(k) = -s(k); }
            for (i = k; i < m; i++) {
              A(i, k) /= s(k);
            }
            A(k, k) += 1.0;
          }
          s(k) = -s(k);
        }
        for (j = k + 1; j < n; j++) {
          if ((k < nct) && (s(k) != 0.0)) {
            // Apply the transformation.

            Real t(0.0);
            for (i = k; i < m; i++) {
              t += A(i, k) * A(i, j);
            }
            t = -t / A(k, k);
            for (i = k; i < m; i++) {
              A(i, j) += t * A(i, k);
            }
          }

          // Place the k-th row of A into e for the
          // subsequent calculation of the row transformation.

          e(j) = A(k, j);
        }
        if (wantu & (k < nct)) {
          // Place the transformation in U for subsequent back
          // multiplication.

          for (i = k; i < m; i++) {
            U(i, k) = A(i, k);
          }
        }
        if (k < nrt) {
          // Compute the k-th row transformation and place the
          // k-th super-diagonal in e(k).
          // Compute 2-norm without under/overflow.
          e(k) = 0;
          for (i = k + 1; i < n; i++) {
            e(k) = hypot(e(k), e(i));
          }
          if (e(k) != 0.0) {
            if (e(k + 1) < 0.0) { e(k) = -e(k); }
            for (i = k + 1; i < n; i++) {
              e(i) /= e(k);
            }
            e(k + 1) += 1.0;
          }
          e(k) = -e(k);
          if ((k + 1 < m) & (e(k) != 0.0)) {
            // Apply the transformation.

            for (i = k + 1; i < m; i++) {
              work(i) = 0.0;
            }
            for (j = k + 1; j < n; j++) {
              for (i = k + 1; i < m; i++) {
                work(i) += e(j) * A(i, j);
              }
            }
            for (j = k + 1; j < n; j++) {
              Real t(-e(j) / e(k + 1));
              for (i = k + 1; i < m; i++) {
                A(i, j) += t * work(i);
              }
            }
          }
          if (wantv) {
            // Place the transformation in V for subsequent
            // back multiplication.

            for (i = k + 1; i < n; i++) {
              V(i, k) = e(i);
            }
          }
        }
      }

      // Set up the final bidiagonal matrix or order p.

      int p = min(n, m + 1);
      if (nct < n) { s(nct) = A(nct, nct); }
      if (m < p) { s(p - 1) = 0.0; }
      if (nrt + 1 < p) { e(nrt) = A(nrt, p - 1); }
      e(p - 1) = 0.0;

      // If required, generate U.

      if (wantu) {
        for (j = nct; j < nu; j++) {
          for (i = 0; i < m; i++) {
            U(i, j) = 0.0;
          }
          U(j, j) = 1.0;
        }
        for (k = nct - 1; k >= 0; k--) {
          if (s(k) != 0.0) {
            for (j = k + 1; j < nu; j++) {
              Real t(0.0);
              for (i = k; i < m; i++) {
                t += U(i, k) * U(i, j);
              }
              t = -t / U(k, k);
              for (i = k; i < m; i++) {
                U(i, j) += t * U(i, k);
              }
            }
            for (i = k; i < m; i++) {
              U(i, k) = -U(i, k);
            }
            U(k, k) = 1.0 + U(k, k);
            for (i = 0; i < k - 1; i++) {
              U(i, k) = 0.0;
            }
          } else {
            for (i = 0; i < m; i++) {
              U(i, k) = 0.0;
            }
            U(k, k) = 1.0;
          }
        }
      }

      // If required, generate V.

      if (wantv) {
        for (k = n - 1; k >= 0; k--) {
          if ((k < nrt) & (e(k) != 0.0)) {
            for (j = k + 1; j < nu; j++) {
              Real t(0.0);
              for (i = k + 1; i < n; i++) {
                t += V(i, k) * V(i, j);
              }
              t = -t / V(k + 1, k);
              for (i = k + 1; i < n; i++) {
                V(i, j) += t * V(i, k);
              }
            }
          }
          for (i = 0; i < n; i++) {
            V(i, k) = 0.0;
          }
          V(k, k) = 1.0;
        }
      }

      // Main iteration loop for the singular values.

      int pp   = p - 1;
      int iter = 0;
      Real eps(pow(2.0, -52.0));
      while (p > 0) {
        int k    = 0;
        int kase = 0;

        // Here is where a test for too many iterations would go.

        // This section of the program inspects for
        // negligible elements in the s and e arrays.  On
        // completion the variables kase and k are set as follows.

        // kase = 1     if s(p) and e(k-1) are negligible and k<p
        // kase = 2     if s(k) is negligible and k<p
        // kase = 3     if e(k-1) is negligible, k<p, and
        //              s(k), ..., s(p) are not negligible (qr step).
        // kase = 4     if e(p-1) is negligible (convergence).

        for (k = p - 2; k >= -1; k--) {
          if (k == -1) { break; }
          if (abs(e(k)) <= eps * (abs(s(k)) + abs(s(k + 1)))) {
            e(k) = 0.0;
            break;
          }
        }
        if (k == p - 2) {
          kase = 4;
        } else {
          int ks;
          for (ks = p - 1; ks >= k; ks--) {
            if (ks == k) { break; }
            Real t((ks != p ? abs(e(ks)) : 0.) +
                   (ks != k + 1 ? abs(e(ks - 1)) : 0.));
            if (abs(s(ks)) <= eps * t) {
              s(ks) = 0.0;
              break;
            }
          }
          if (ks == k) {
            kase = 3;
          } else if (ks == p - 1) {
            kase = 1;
          } else {
            kase = 2;
            k    = ks;
          }
        }
        k++;

        // Perform the task indicated by kase.

        switch (kase) {
          // Deflate negligible s(p).

        case 1: {
          Real f(e(p - 2));
          e(p - 2) = 0.0;
          for (j = p - 2; j >= k; j--) {
            Real t(hypot(s(j), f));
            Real cs(s(j) / t);
            Real sn(f / t);
            s(j) = t;
            if (j != k) {
              f        = -sn * e(j - 1);
              e(j - 1) = cs * e(j - 1);
            }
            if (wantv) {
              for (i = 0; i < n; i++) {
                t           = cs * V(i, j) + sn * V(i, p - 1);
                V(i, p - 1) = -sn * V(i, j) + cs * V(i, p - 1);
                V(i, j)     = t;
              }
            }
          }
        } break;

          // Split at negligible s(k).

        case 2: {
          Real f(e(k - 1));
          e(k - 1) = 0.0;
          for (j = k; j < p; j++) {
            Real t(hypot(s(j), f));
            Real cs(s(j) / t);
            Real sn(f / t);
            s(j) = t;
            f    = -sn * e(j);
            e(j) = cs * e(j);
            if (wantu) {
              for (i = 0; i < m; i++) {
                t           = cs * U(i, j) + sn * U(i, k - 1);
                U(i, k - 1) = -sn * U(i, j) + cs * U(i, k - 1);
                U(i, j)     = t;
              }
            }
          }
        } break;

          // Perform one qr step.

        case 3: {
          // Calculate the shift.

          Real scale =
              max(max(max(max(abs(s(p - 1)), abs(s(p - 2))), abs(e(p - 2))),
                      abs(s(k))),
                  abs(e(k)));
          Real sp    = s(p - 1) / scale;
          Real spm1  = s(p - 2) / scale;
          Real epm1  = e(p - 2) / scale;
          Real sk    = s(k) / scale;
          Real ek    = e(k) / scale;
          Real b     = ((spm1 + sp) * (spm1 - sp) + epm1 * epm1) / 2.0;
          Real c     = (sp * epm1) * (sp * epm1);
          Real shift = 0.0;
          if ((b != 0.0) || (c != 0.0)) {
            shift = sqrt(b * b + c);
            if (b < 0.0) { shift = -shift; }
            shift = c / (b + shift);
          }
          Real f = (sk + sp) * (sk - sp) + shift;
          Real g = sk * ek;

          // Chase zeros.

          for (j = k; j < p - 1; j++) {
            Real t  = hypot(f, g);
            Real cs = f / t;
            Real sn = g / t;
            if (j != k) { e(j - 1) = t; }
            f        = cs * s(j) + sn * e(j);
            e(j)     = cs * e(j) - sn * s(j);
            g        = sn * s(j + 1);
            s(j + 1) = cs * s(j + 1);
            if (wantv) {
              for (i = 0; i < n; i++) {
                t           = cs * V(i, j) + sn * V(i, j + 1);
                V(i, j + 1) = -sn * V(i, j) + cs * V(i, j + 1);
                V(i, j)     = t;
              }
            }
            t        = hypot(f, g);
            cs       = f / t;
            sn       = g / t;
            s(j)     = t;
            f        = cs * e(j) + sn * s(j + 1);
            s(j + 1) = -sn * e(j) + cs * s(j + 1);
            g        = sn * e(j + 1);
            e(j + 1) = cs * e(j + 1);
            if (wantu && (j < m - 1)) {
              for (i = 0; i < m; i++) {
                t           = cs * U(i, j) + sn * U(i, j + 1);
                U(i, j + 1) = -sn * U(i, j) + cs * U(i, j + 1);
                U(i, j)     = t;
              }
            }
          }
          e(p - 2) = f;
          iter     = iter + 1;
        } break;

          // Convergence.

        case 4: {
          // Make the singular values positive.

          if (s(k) <= 0.0) {
            s(k) = (s(k) < 0.0 ? -s(k) : 0.0);
            if (wantv) {
              for (i = 0; i <= pp; i++) {
                V(i, k) = -V(i, k);
              }
            }
          }

          // Order the singular values.

          while (k < pp) {
            if (s(k) >= s(k + 1)) { break; }
            Real t   = s(k);
            s(k)     = s(k + 1);
            s(k + 1) = t;
            if (wantv && (k < n - 1)) {
              for (i = 0; i < n; i++) {
                t           = V(i, k + 1);
                V(i, k + 1) = V(i, k);
                V(i, k)     = t;
              }
            }
            if (wantu && (k < m - 1)) {
              for (i = 0; i < m; i++) {
                t           = U(i, k + 1);
                U(i, k + 1) = U(i, k);
                U(i, k)     = t;
              }
            }
            k++;
          }
          iter = 0;
          p--;
        } break;
        }
      }
    }